

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

GLSLstd450 __thiscall
spirv_cross::CompilerGLSL::get_remapped_glsl_op(CompilerGLSL *this,GLSLstd450 std450_op)

{
  if (((this->options).relax_nan_checks == true) && (std450_op - GLSLstd450NMin < 3)) {
    std450_op = (std450_op - GLSLstd450NMin) * 3 + GLSLstd450FMin;
  }
  return std450_op;
}

Assistant:

GLSLstd450 CompilerGLSL::get_remapped_glsl_op(GLSLstd450 std450_op) const
{
	// Relax to non-NaN aware opcodes.
	if (options.relax_nan_checks)
	{
		switch (std450_op)
		{
		case GLSLstd450NClamp:
			std450_op = GLSLstd450FClamp;
			break;
		case GLSLstd450NMin:
			std450_op = GLSLstd450FMin;
			break;
		case GLSLstd450NMax:
			std450_op = GLSLstd450FMax;
			break;
		default:
			break;
		}
	}

	return std450_op;
}